

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::ArrayBuilder<kj::String>::clear(ArrayBuilder<kj::String> *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  String *pSVar4;
  String *pSVar5;
  String *pSVar6;
  
  pSVar5 = this->ptr;
  pSVar6 = this->pos;
  if (pSVar5 < pSVar6) {
    do {
      pSVar4 = pSVar6 + -1;
      this->pos = pSVar4;
      pcVar1 = pSVar6[-1].content.ptr;
      if (pcVar1 != (char *)0x0) {
        sVar2 = pSVar6[-1].content.size_;
        (pSVar4->content).ptr = (char *)0x0;
        pSVar6[-1].content.size_ = 0;
        pAVar3 = pSVar6[-1].content.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
        pSVar5 = this->ptr;
        pSVar4 = this->pos;
      }
      pSVar6 = pSVar4;
    } while (pSVar5 < pSVar6);
  }
  return;
}

Assistant:

void clear() {
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(ptr);
    } else {
      while (pos > ptr) {
        kj::dtor(*--pos);
      }
    }
  }